

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_unpack_(void *inbuf,MPIABI_Fint *insize,int *position,void *outbuf,MPIABI_Fint *outcount
                   ,MPIABI_Fint *datatype,MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  MPIABI_Fint *datatype_local;
  MPIABI_Fint *outcount_local;
  void *outbuf_local;
  int *position_local;
  MPIABI_Fint *insize_local;
  void *inbuf_local;
  
  mpi_unpack_(inbuf,insize,position,outbuf,outcount,datatype,comm,ierror);
  return;
}

Assistant:

void mpiabi_unpack_(
  const void * inbuf,
  const MPIABI_Fint * insize,
  int * position,
  void * outbuf,
  const MPIABI_Fint * outcount,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_unpack_(
    inbuf,
    insize,
    position,
    outbuf,
    outcount,
    datatype,
    comm,
    ierror
  );
}